

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,char *internalDependsFileName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  size_t this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *pmVar1;
  bool bVar2;
  long *plVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  allocator local_5d1;
  string local_5d0;
  allocator local_5a9;
  key_type local_5a8;
  string local_588 [32];
  ostringstream local_568 [8];
  ostringstream msg_2;
  int local_3ec;
  string local_3e8 [4];
  int result_1;
  ostringstream local_3c8 [8];
  ostringstream msg_1;
  int local_24c;
  string local_248 [4];
  int result;
  ostringstream local_228 [8];
  ostringstream msg;
  allocator local_a9;
  value_type local_a8;
  char *local_88;
  char *depender;
  char *dependee;
  bool regenerate;
  allocator local_61;
  key_type local_60;
  long local_40;
  size_t len;
  DependencyVector *currentDependencies;
  bool dependerExists;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *pmStack_28;
  bool okay;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *validDeps_local;
  char *internalDependsFileName_local;
  istream *internalDepends_local;
  cmDepends *this_local;
  
  currentDependencies._7_1_ = 1;
  currentDependencies._6_1_ = 0;
  len = 0;
  pmStack_28 = validDeps;
  validDeps_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
        *)internalDependsFileName;
  internalDependsFileName_local = (char *)internalDepends;
  internalDepends_local = (istream *)this;
  while( true ) {
    plVar3 = (long *)std::istream::getline(internalDependsFileName_local,(long)this->Dependee);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar2) break;
    if (((*this->Dependee != '\0') && (*this->Dependee != '#')) && (*this->Dependee != '\r')) {
      lVar4 = std::istream::gcount();
      this_00 = len;
      local_40 = lVar4 + -1;
      if (this->Dependee[lVar4 + -2] == '\r') {
        local_40 = lVar4 + -2;
        this->Dependee[local_40] = '\0';
      }
      if (*this->Dependee == ' ') {
        dependee._3_1_ = 0;
        pcVar6 = this->Dependee + 1;
        local_88 = this->Depender;
        depender = pcVar6;
        if (len != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a8,pcVar6,&local_a9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        }
        bVar2 = cmsys::SystemTools::FileExists(depender);
        if (bVar2) {
          if ((currentDependencies._6_1_ & 1) == 0) {
            local_3ec = 0;
            bVar2 = cmFileTimeComparison::FileTimeCompare
                              (this->FileComparison,(char *)validDeps_local,depender,&local_3ec);
            if (((!bVar2) || (local_3ec < 0)) && (dependee._3_1_ = 1, (this->Verbose & 1U) != 0)) {
              std::__cxx11::ostringstream::ostringstream(local_568);
              poVar5 = std::operator<<((ostream *)local_568,"Dependee \"");
              poVar5 = std::operator<<(poVar5,depender);
              poVar5 = std::operator<<(poVar5,"\" is newer than depends file \"");
              poVar5 = std::operator<<(poVar5,(char *)validDeps_local);
              poVar5 = std::operator<<(poVar5,"\".");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Stdout(pcVar6);
              std::__cxx11::string::~string(local_588);
              std::__cxx11::ostringstream::~ostringstream(local_568);
            }
          }
          else {
            local_24c = 0;
            bVar2 = cmFileTimeComparison::FileTimeCompare
                              (this->FileComparison,local_88,depender,&local_24c);
            if (((!bVar2) || (local_24c < 0)) && (dependee._3_1_ = 1, (this->Verbose & 1U) != 0)) {
              std::__cxx11::ostringstream::ostringstream(local_3c8);
              poVar5 = std::operator<<((ostream *)local_3c8,"Dependee \"");
              poVar5 = std::operator<<(poVar5,depender);
              poVar5 = std::operator<<(poVar5,"\" is newer than depender \"");
              poVar5 = std::operator<<(poVar5,local_88);
              poVar5 = std::operator<<(poVar5,"\".");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Stdout(pcVar6);
              std::__cxx11::string::~string(local_3e8);
              std::__cxx11::ostringstream::~ostringstream(local_3c8);
            }
          }
        }
        else {
          dependee._3_1_ = 1;
          if ((this->Verbose & 1U) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_228);
            poVar5 = std::operator<<((ostream *)local_228,"Dependee \"");
            poVar5 = std::operator<<(poVar5,depender);
            poVar5 = std::operator<<(poVar5,"\" does not exist for depender \"");
            poVar5 = std::operator<<(poVar5,local_88);
            poVar5 = std::operator<<(poVar5,"\".");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Stdout(pcVar6);
            std::__cxx11::string::~string(local_248);
            std::__cxx11::ostringstream::~ostringstream(local_228);
          }
        }
        pmVar1 = pmStack_28;
        if ((dependee._3_1_ & 1) != 0) {
          currentDependencies._7_1_ = 0;
          if (len != 0) {
            pcVar6 = this->Depender;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_5a8,pcVar6,&local_5a9);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
            ::erase(pmVar1,&local_5a8);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
            len = 0;
          }
          pcVar6 = local_88;
          if ((currentDependencies._6_1_ & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_5d0,pcVar6,&local_5d1);
            cmsys::SystemTools::RemoveFile(&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
            currentDependencies._6_1_ = 0;
          }
        }
      }
      else {
        memcpy(this->Depender,this->Dependee,local_40 + 1);
        currentDependencies._6_1_ = cmsys::SystemTools::FileExists(this->Depender);
        pmVar1 = pmStack_28;
        pcVar6 = this->Depender;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_60,pcVar6,&local_61);
        len = (size_t)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                      ::operator[](pmVar1,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
    }
  }
  return (bool)(currentDependencies._7_1_ & 1);
}

Assistant:

bool cmDepends::CheckDependencies(
  std::istream& internalDepends, const char* internalDependsFileName,
  std::map<std::string, DependencyVector>& validDeps)
{
  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;
  DependencyVector* currentDependencies = CM_NULLPTR;

  while (internalDepends.getline(this->Dependee, this->MaxPath)) {
    if (this->Dependee[0] == 0 || this->Dependee[0] == '#' ||
        this->Dependee[0] == '\r') {
      continue;
    }
    size_t len = internalDepends.gcount() - 1;
    if (this->Dependee[len - 1] == '\r') {
      len--;
      this->Dependee[len] = 0;
    }
    if (this->Dependee[0] != ' ') {
      memcpy(this->Depender, this->Dependee, len + 1);
      // Calling FileExists() for the depender here saves in many cases 50%
      // of the calls to FileExists() further down in the loop. E.g. for
      // kdelibs/khtml this reduces the number of calls from 184k down to 92k,
      // or the time for cmake -E cmake_depends from 0.3 s down to 0.21 s.
      dependerExists = cmSystemTools::FileExists(this->Depender);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[this->Depender];
      continue;
    }
    /*
    // Parse the dependency line.
    if(!this->ParseDependency(line.c_str()))
      {
      continue;
      }
      */

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    const char* dependee = this->Dependee + 1;
    const char* depender = this->Depender;
    if (currentDependencies != CM_NULLPTR) {
      currentDependencies->push_back(dependee);
    }

    if (!cmSystemTools::FileExists(dependee)) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
      }
    } else {
      if (dependerExists) {
        // The dependee and depender both exist.  Compare file times.
        int result = 0;
        if ((!this->FileComparison->FileTimeCompare(depender, dependee,
                                                    &result) ||
             result < 0)) {
          // The depender is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee << "\" is newer than depender \""
                << depender << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str().c_str());
          }
        }
      } else {
        // The dependee exists, but the depender doesn't. Regenerate if the
        // internalDepends file is older than the dependee.
        int result = 0;
        if ((!this->FileComparison->FileTimeCompare(internalDependsFileName,
                                                    dependee, &result) ||
             result < 0)) {
          // The depends-file is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depends file \""
                << internalDependsFileName << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str().c_str());
          }
        }
      }
    }
    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != CM_NULLPTR) {
        validDeps.erase(this->Depender);
        currentDependencies = CM_NULLPTR;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}